

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

PacketList * __thiscall
ASDCP::MXF::Partition::PacketList::DeleteMDObjectByID(PacketList *this,UUID *ObjectID)

{
  _Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,ASDCP::MXF::InterchangeObject*>,std::_Select1st<std::pair<Kumu::UUID_const,ASDCP::MXF::InterchangeObject*>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,ASDCP::MXF::InterchangeObject*>>>
  *this_00;
  iterator __position;
  key_type *in_RDX;
  undefined1 *puVar1;
  
  this_00 = (_Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,ASDCP::MXF::InterchangeObject*>,std::_Select1st<std::pair<Kumu::UUID_const,ASDCP::MXF::InterchangeObject*>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,ASDCP::MXF::InterchangeObject*>>>
             *)((ObjectID->super_Identifier<16U>).m_Value + 0xf);
  __position = std::
               _Rb_tree<Kumu::UUID,_std::pair<const_Kumu::UUID,_ASDCP::MXF::InterchangeObject_*>,_std::_Select1st<std::pair<const_Kumu::UUID,_ASDCP::MXF::InterchangeObject_*>_>,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_ASDCP::MXF::InterchangeObject_*>_>_>
               ::find((_Rb_tree<Kumu::UUID,_std::pair<const_Kumu::UUID,_ASDCP::MXF::InterchangeObject_*>,_std::_Select1st<std::pair<const_Kumu::UUID,_ASDCP::MXF::InterchangeObject_*>_>,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_ASDCP::MXF::InterchangeObject_*>_>_>
                       *)this_00,in_RDX);
  if (__position._M_node == (_Base_ptr)(ObjectID + 1)) {
    puVar1 = Kumu::RESULT_FAIL;
  }
  else {
    if (*(long **)(__position._M_node + 2) != (long *)0x0) {
      (**(code **)(**(long **)(__position._M_node + 2) + 8))();
    }
    std::
    _Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,ASDCP::MXF::InterchangeObject*>,std::_Select1st<std::pair<Kumu::UUID_const,ASDCP::MXF::InterchangeObject*>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,ASDCP::MXF::InterchangeObject*>>>
    ::erase_abi_cxx11_(this_00,__position);
    puVar1 = (undefined1 *)&Kumu::RESULT_OK;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar1);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Partition::PacketList::DeleteMDObjectByID(const UUID& ObjectID)
{
  std::map<UUID, InterchangeObject*>::iterator mi = m_Map.find(ObjectID);
  
  if ( mi == m_Map.end() )
    {
       return RESULT_FAIL;
    }

  delete (*mi).second;
  m_Map.erase(mi);
  return RESULT_OK;
}